

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O3

void __thiscall MetricsDiscovery::MDHelper::~MDHelper(MDHelper *this)

{
  IAdapterLatest *pIVar1;
  pointer pcVar2;
  int iVar3;
  IAdapterGroupLatest *pIVar4;
  
  if (((this->m_Activated == true) && (this->m_Initialized == true)) &&
     (this->m_MetricSet != (IMetricSetLatest *)0x0)) {
    iVar3 = (**(code **)(*(long *)this->m_MetricSet + 0x38))();
    this->m_Activated = iVar3 != 0;
  }
  pIVar4 = this->m_AdapterGroup;
  if (pIVar4 == (IAdapterGroupLatest *)0x0) {
    if ((this->CloseMetricsDevice != (CloseMetricsDevice_fn)0x0) &&
       (this->m_MetricsDevice != (IMetricsDeviceLatest *)0x0)) {
      (*this->CloseMetricsDevice)(this->m_MetricsDevice);
      this->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
    }
  }
  else {
    pIVar1 = this->m_Adapter;
    if ((pIVar1 != (IAdapterLatest *)0x0) && (this->m_MetricsDevice != (IMetricsDeviceLatest *)0x0))
    {
      (**(code **)(*(long *)pIVar1 + 0x30))(pIVar1);
      this->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
      pIVar4 = this->m_AdapterGroup;
    }
    (**(code **)(*(long *)pIVar4 + 0x20))();
    this->m_AdapterGroup = (IAdapterGroupLatest *)0x0;
    this->m_Adapter = (IAdapterLatest *)0x0;
  }
  this->m_Initialized = false;
  pcVar2 = (this->m_SavedReportData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

MDHelper::~MDHelper()
{
    if( m_Activated )
    {
        DeactivateMetricSet();
    }

    if( m_AdapterGroup != NULL )
    {
        if( m_Adapter && m_MetricsDevice )
        {
            m_Adapter->CloseMetricsDevice( m_MetricsDevice );
            m_MetricsDevice = NULL;
        }

        m_AdapterGroup->Close();
        m_AdapterGroup = NULL;
        m_Adapter = NULL;
    }
    else if( CloseMetricsDevice != NULL && m_MetricsDevice )
    {
        CloseMetricsDevice( m_MetricsDevice );
        m_MetricsDevice = NULL;
    }

    m_Initialized = false;
}